

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O1

void __thiscall Application::fromAdmin(Application *this,Message *message,SessionID *sessionID)

{
  int iVar1;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var2;
  long lVar3;
  DefaultApplVerID defaultApplVerID;
  MsgType msgType;
  FieldBase local_d8;
  FieldBase local_78;
  
  FIX::StringField::StringField((StringField *)&local_78,0x23);
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00175cb8;
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),&local_78);
  iVar1 = std::__cxx11::string::compare((char *)&local_78.m_string);
  if (iVar1 == 0) {
    FIX::StringField::StringField((StringField *)&local_d8,0x471);
    local_d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00175cf0;
    _Var2 = FIX::FieldMap::
            lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                      ((FieldMap *)message,*(FieldBase **)(message + 8),
                       *(FieldBase **)(message + 0x10),local_d8.m_tag);
    if (_Var2._M_current != *(FieldBase **)(message + 0x10)) {
      FIX::FieldMap::getField((FieldMap *)message,&local_d8);
      lVar3 = FIX::Session::lookupSession(sessionID);
      std::__cxx11::string::_M_assign((string *)(lVar3 + 0x1f8));
    }
    FIX::FieldBase::~FieldBase(&local_d8);
  }
  FIX::FieldBase::~FieldBase(&local_78);
  return;
}

Assistant:

EXCEPT( FIX::FieldNotFound, FIX::IncorrectDataFormat, FIX::IncorrectTagValue, FIX::RejectLogon )
  {
    FIX::MsgType msgType;
    message.getHeader().getField( msgType );
    if(msgType == FIX::MsgType_Logon)
    {
      FIX::DefaultApplVerID defaultApplVerID;
      if(message.isSetField(defaultApplVerID))
      {
        message.getField(defaultApplVerID);
        FIX::Session::lookupSession(sessionID)->setSenderDefaultApplVerID(defaultApplVerID);
      }
    }
  }